

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O1

char * next_log_token(void)

{
  char *pcVar1;
  char cVar2;
  undefined8 in_RAX;
  long lVar3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  char *unaff_R14;
  char c;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  lVar3 = ftell((FILE *)loginfo.flog);
  iVar5 = 0;
  loginfo.last_token_start = lVar3;
  do {
    if (next_log_token::rbuflen <= iVar5) {
      next_log_token::rbuflen = next_log_token::rbuflen * 2;
      if (next_log_token::rbuflen < 0x101) {
        next_log_token::rbuflen = 0x100;
      }
      next_log_token::rbuf =
           (char *)realloc(next_log_token::rbuf,(ulong)(uint)next_log_token::rbuflen);
    }
    pcVar1 = next_log_token::rbuf;
    lVar6 = (long)iVar5;
    if ((ulong)(lVar3 + lVar6) < loginfo.endpos) {
      sVar4 = fread((void *)((long)&uStack_38 + 7),1,1,(FILE *)loginfo.flog);
      if (sVar4 != 1) {
        raw_printf("Unexpected EOF or error in save file");
        terminate();
      }
      next_log_token::rbuf[lVar6] = uStack_38._7_1_;
      if (((ulong)uStack_38._7_1_ < 0x21) &&
         ((0x100002400U >> ((ulong)uStack_38._7_1_ & 0x3f) & 1) != 0)) {
        cVar2 = (iVar5 != 0) * '\x03';
      }
      else {
        iVar5 = iVar5 + 1;
        cVar2 = '\0';
      }
    }
    else {
      next_log_token::rbuf[lVar6] = '\0';
      unaff_R14 = (char *)0x0;
      if (iVar5 != 0) {
        unaff_R14 = pcVar1;
      }
      cVar2 = '\x01';
    }
    pcVar1 = next_log_token::rbuf;
  } while (cVar2 == '\0');
  if (cVar2 == '\x03') {
    next_log_token::rbuf[iVar5] = '\0';
    unaff_R14 = pcVar1;
  }
  return unaff_R14;
}

Assistant:

static char *next_log_token(void)
{
    static char *rbuf = NULL;
    static int rbuflen = 0;

    int rbpos = 0;
    long filepos = ftell(loginfo.flog);

    loginfo.last_token_start = filepos;
    while (1) {
	char c;
	if (rbpos >= rbuflen) {
	    rbuflen *= 2;
	    if (rbuflen < 256) rbuflen = 256;
	    rbuf = realloc(rbuf, rbuflen);
	}
	if (rbpos + filepos >= loginfo.endpos) {
	    rbuf[rbpos] = 0;
	    return rbpos ? rbuf : NULL;
	}
	if (fread(&c, 1, 1, loginfo.flog) != 1) {
	    raw_printf("Unexpected EOF or error in save file");
	    terminate();
	}
	rbuf[rbpos] = c;
	if (c == '\r' || c == '\n' || c == ' ') {
	    if (rbpos != 0) break;
	    /* otherwise overwrite the redundant whitespace the next time
	     * round the loop */
	} else {
	    rbpos++;
	}
    }
    rbuf[rbpos] = 0;
    return rbuf;
}